

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

int QMdi::MinOverlapPlacer::accumulatedOverlap(QRect *source,QList<QRect> *rects)

{
  int iVar1;
  QRect *rect;
  QRect *pQVar2;
  long lVar3;
  undefined1 auVar4 [16];
  
  lVar3 = (rects->d).size;
  if (lVar3 == 0) {
    iVar1 = 0;
  }
  else {
    pQVar2 = (rects->d).ptr;
    lVar3 = lVar3 << 4;
    iVar1 = 0;
    do {
      auVar4 = QRect::operator&(source,pQVar2);
      iVar1 = iVar1 + ((auVar4._12_4_ - auVar4._4_4_) + 1) * ((auVar4._8_4_ - auVar4._0_4_) + 1);
      pQVar2 = pQVar2 + 1;
      lVar3 = lVar3 + -0x10;
    } while (lVar3 != 0);
  }
  return iVar1;
}

Assistant:

const T *constEnd() const noexcept { return data() + size; }